

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void wasm::SimplifyLocals<false,_false,_false>::doNoteNonLinear
               (SimplifyLocals<false,_false,_false> *self,Expression **currp)

{
  Id IVar1;
  Expression *this;
  If *pIVar2;
  _Base_ptr p_Var3;
  vector<wasm::SimplifyLocals<false,false,false>::BlockBreak,std::allocator<wasm::SimplifyLocals<false,false,false>::BlockBreak>>
  *this_00;
  undefined1 local_80 [8];
  NameSet targets;
  undefined1 auStack_48 [8];
  Name target;
  
  this = *currp;
  IVar1 = this->_id;
  if (IVar1 != BlockId) {
    if (IVar1 == IfId) {
      pIVar2 = Expression::cast<wasm::If>(this);
      if (pIVar2->ifFalse != (Expression *)0x0) {
        __assert_fail("!curr->cast<If>() ->ifFalse",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                      ,0x91,
                      "static void wasm::SimplifyLocals<false, false, false>::doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = false, allowStructure = false, allowNesting = false]"
                     );
      }
    }
    else if (IVar1 == BreakId) {
      if (*(long *)(this + 2) == 0) {
        this_00 = (vector<wasm::SimplifyLocals<false,false,false>::BlockBreak,std::allocator<wasm::SimplifyLocals<false,false,false>::BlockBreak>>
                   *)std::
                     map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_false,_false>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_false,_false>::BlockBreak>_>_>_>_>
                     ::operator[](&self->blockBreaks,(key_type *)(this + 1));
        local_80 = (undefined1  [8])currp;
        std::_Rb_tree_header::_Rb_tree_header
                  (&targets._M_t._M_impl.super__Rb_tree_header,
                   &(self->sinkables)._M_t._M_impl.super__Rb_tree_header);
        std::
        vector<wasm::SimplifyLocals<false,false,false>::BlockBreak,std::allocator<wasm::SimplifyLocals<false,false,false>::BlockBreak>>
        ::emplace_back<wasm::SimplifyLocals<false,false,false>::BlockBreak>
                  (this_00,(BlockBreak *)local_80);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
                     *)&targets);
      }
      else {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&self->unoptimizableBlocks,(Name *)(this + 1));
      }
    }
    else {
      BranchUtils::getUniqueTargets((NameSet *)local_80,this);
      for (p_Var3 = targets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var3 != (_Rb_tree_node_base *)&targets;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        auStack_48 = *(undefined1 (*) [8])(p_Var3 + 1);
        target.super_IString.str._M_len = (size_t)p_Var3[1]._M_parent;
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&self->unoptimizableBlocks,(Name *)auStack_48);
      }
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_80);
    }
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_false,_false>::SinkableInfo>_>_>
    ::clear(&(self->sinkables)._M_t);
  }
  return;
}

Assistant:

static void
  doNoteNonLinear(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
                  Expression** currp) {
    // Main processing.
    auto* curr = *currp;
    if (auto* br = curr->dynCast<Break>()) {
      if (br->value) {
        // value means the block already has a return value
        self->unoptimizableBlocks.insert(br->name);
      } else {
        self->blockBreaks[br->name].push_back(
          {currp, std::move(self->sinkables)});
      }
    } else if (curr->is<Block>()) {
      return; // handled in visitBlock
    } else if (curr->is<If>()) {
      assert(!curr->cast<If>()
                ->ifFalse); // if-elses are handled by doNoteIf* methods
    } else {
      // Not one of the recognized instructions, so do not optimize here: mark
      // all the targets as unoptimizable.
      // TODO optimize BrOn, Switch, etc.
      auto targets = BranchUtils::getUniqueTargets(curr);
      for (auto target : targets) {
        self->unoptimizableBlocks.insert(target);
      }
      // TODO: we could use this info to stop gathering data on these blocks
    }
    self->sinkables.clear();
  }